

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_AsmOperand(SyntaxDumper *this,ExtGNU_AsmOperandSyntax *node)

{
  SyntaxToken local_50;
  
  ExtGNU_AsmOperandSyntax::openBracketToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->oprdName_);
  ExtGNU_AsmOperandSyntax::closeBracketToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->constr_);
  ExtGNU_AsmOperandSyntax::openParenthesisToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->expr_);
  ExtGNU_AsmOperandSyntax::closeParenthesisToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_AsmOperand(const ExtGNU_AsmOperandSyntax* node) override
    {
        terminal(node->openBracketToken(), node);
        nonterminal(node->operandName());
        terminal(node->closeBracketToken(), node);
        nonterminal(node->constraint());
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->expression());
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }